

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.h
# Opt level: O0

string * __thiscall
soul::
joinStrings<std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>,soul::annotationToString[abi:cxx11](soul::StringDictionary_const&,std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>const*,bool)::__0>
          (string *__return_storage_ptr__,soul *this,
          vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *strings,
          string *separator,anon_class_16_2_5ea63ecc *stringify)

{
  ulong uVar1;
  string *psVar2;
  bool bVar3;
  const_reference pvVar4;
  size_type sVar5;
  string local_68;
  ulong local_38;
  size_t i;
  string *local_28;
  anon_class_16_2_5ea63ecc *stringify_local;
  string *separator_local;
  vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *strings_local;
  string *s;
  
  local_28 = separator;
  stringify_local = (anon_class_16_2_5ea63ecc *)strings;
  separator_local = (string *)this;
  strings_local =
       (vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *)
       __return_storage_ptr__;
  bVar3 = std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>::
          empty((vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *)
                this);
  psVar2 = local_28;
  if (bVar3) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    i._7_1_ = 0;
    pvVar4 = std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>::
             front((vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>
                    *)separator_local);
    annotationToString[abi:cxx11](soul::StringDictionary_const&,std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>const*,bool)
    ::$_0::operator()(__return_storage_ptr__,(__0 *)psVar2,pvVar4);
    for (local_38 = 1; uVar1 = local_38,
        sVar5 = std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>
                ::size((vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>
                        *)separator_local), uVar1 < sVar5; local_38 = local_38 + 1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)stringify_local);
      psVar2 = local_28;
      pvVar4 = std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>
               ::operator[]((vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>
                             *)separator_local,local_38);
      annotationToString[abi:cxx11](soul::StringDictionary_const&,std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>const*,bool)
      ::$_0::operator()(&local_68,(__0 *)psVar2,pvVar4);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string joinStrings (const Array& strings, const std::string& separator, StringifyFn&& stringify)
{
    if (strings.empty())
        return {};

    std::string s (stringify (strings.front()));

    for (size_t i = 1; i < strings.size(); ++i)
    {
        s += separator;
        s += stringify (strings[i]);
    }

    return s;
}